

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O2

void __thiscall MPL::detail::ModelPackageImpl::removeItem(ModelPackageImpl *this,string *identifier)

{
  int iVar1;
  runtime_error *prVar2;
  allocator<char> local_b9;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntry;
  string local_b0;
  path path;
  path local_68;
  string local_40;
  
  getItemInfoEntry((ModelPackageImpl *)&itemInfoEntry,(string *)this);
  if ((__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>)
      itemInfoEntry._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
      super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
      super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&path._M_pathname,"Failed to look up file with identifier: ",identifier);
    std::runtime_error::runtime_error(prVar2,(string *)&path);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"path",&local_b9);
  JsonMap::getString(&local_b0,
                     (JsonMap *)
                     itemInfoEntry._M_t.
                     super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                     super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                     super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,&local_40);
  std::filesystem::__cxx11::path::path(&local_68,&local_b0,auto_format);
  std::filesystem::__cxx11::operator/(&path,&this->m_packageDataDirPath,&local_68);
  std::filesystem::__cxx11::path::~path(&local_68);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_40);
  iVar1 = remove(path._M_pathname._M_dataplus._M_p);
  if (iVar1 == 0) {
    removeItemInfoEntry(this,identifier);
    std::filesystem::__cxx11::path::~path(&path);
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr(&itemInfoEntry);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::filesystem::__cxx11::path::string(&local_b0,&path);
  std::operator+(&local_68._M_pathname,"Failed to remove file at path: ",&local_b0);
  std::runtime_error::runtime_error(prVar2,(string *)&local_68);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ModelPackageImpl::removeItem(const std::string& identifier)
{
    auto itemInfoEntry = getItemInfoEntry(identifier);
    if (itemInfoEntry == nullptr) {
        throw std::runtime_error("Failed to look up file with identifier: " + identifier);
    }
    
    auto path = m_packageDataDirPath / itemInfoEntry->getString(kModelPackageItemInfoPathKey);
    if (0 != std::remove(path.c_str())) {
        throw std::runtime_error("Failed to remove file at path: " + path.string());
    }
    
    removeItemInfoEntry(identifier);
}